

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_info.hpp
# Opt level: O3

string * __thiscall
chaiscript::Type_Info::bare_name_abi_cxx11_(string *__return_storage_ptr__,Type_Info *this)

{
  char *pcVar1;
  allocator local_9;
  
  if (this->m_bare_type_info == (type_info *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    pcVar1 = *(char **)(this->m_bare_type_info + 8);
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,pcVar1 + (*pcVar1 == '*'),&local_9);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string bare_name() const
      {
        if (m_bare_type_info)
        {
          return m_bare_type_info->name();
        } else {
          return "";
        }
      }